

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractproxymodel.cpp
# Opt level: O1

void __thiscall QAbstractProxyModelPrivate::emitHeaderDataChanged(QAbstractProxyModelPrivate *this)

{
  long lVar1;
  QObject *this_00;
  int iVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->super_QAbstractItemModelPrivate).super_QObjectPrivate.super_QObjectData.q_ptr;
  if ((this->field_0xe0 & 8) != 0) {
    iVar2 = (*this_00->_vptr_QObject[0x10])(this_00);
    if (0 < iVar2) {
      QAbstractItemModel::headerDataChanged((QAbstractItemModel *)this_00,Horizontal,0,iVar2 + -1);
    }
  }
  if ((this->field_0xe0 & 4) != 0) {
    iVar2 = (*this_00->_vptr_QObject[0xf])(this_00);
    if (0 < iVar2) {
      QAbstractItemModel::headerDataChanged((QAbstractItemModel *)this_00,Vertical,0,iVar2 + -1);
    }
  }
  this->field_0xe0 = this->field_0xe0 & 0xf3;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractProxyModelPrivate::emitHeaderDataChanged()
{
    Q_Q(QAbstractProxyModel);

    if (updateHorizontalHeader) {
        if (auto columnCount = q->columnCount(); columnCount > 0)
            emit q->headerDataChanged(Qt::Horizontal, 0, columnCount - 1);
    }

    if (updateVerticalHeader) {
        if (auto rowCount = q->rowCount(); rowCount > 0)
            emit q->headerDataChanged(Qt::Vertical, 0, rowCount - 1);
    }

    updateHorizontalHeader = false;
    updateVerticalHeader = false;
}